

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primref.h
# Opt level: O3

void std::__move_median_to_first<embree::PrimRef*,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,undefined8 *__a,undefined8 *__b,undefined8 *__c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  uVar6 = CONCAT44(*(undefined4 *)((long)__a + 0x1c),*(undefined4 *)((long)__a + 0xc));
  uVar7 = CONCAT44(*(undefined4 *)((long)__b + 0x1c),*(undefined4 *)((long)__b + 0xc));
  uVar8 = CONCAT44(*(undefined4 *)((long)__c + 0x1c),*(undefined4 *)((long)__c + 0xc));
  if (uVar6 < uVar7) {
    if (uVar7 < uVar8) {
      uVar1 = *__result;
      uVar2 = __result[1];
      uVar3 = __result[2];
      uVar4 = __result[3];
      uVar5 = __b[1];
      *__result = *__b;
      __result[1] = uVar5;
      uVar5 = __b[3];
      __result[2] = __b[2];
      __result[3] = uVar5;
      *__b = uVar1;
      __b[1] = uVar2;
      __b[2] = uVar3;
      __b[3] = uVar4;
      return;
    }
    uVar13 = *(undefined4 *)__result;
    uVar14 = *(undefined4 *)((long)__result + 4);
    uVar15 = *(undefined4 *)(__result + 1);
    uVar16 = *(undefined4 *)((long)__result + 0xc);
    uVar9 = *(undefined4 *)(__result + 2);
    uVar10 = *(undefined4 *)((long)__result + 0x14);
    uVar11 = *(undefined4 *)(__result + 3);
    uVar12 = *(undefined4 *)((long)__result + 0x1c);
    if (uVar8 <= uVar6) {
      uVar1 = __a[1];
      *__result = *__a;
      __result[1] = uVar1;
      uVar1 = __a[3];
      __result[2] = __a[2];
      __result[3] = uVar1;
      *(undefined4 *)__a = uVar13;
      *(undefined4 *)((long)__a + 4) = uVar14;
      *(undefined4 *)(__a + 1) = uVar15;
      *(undefined4 *)((long)__a + 0xc) = uVar16;
      *(undefined4 *)(__a + 2) = uVar9;
      *(undefined4 *)((long)__a + 0x14) = uVar10;
      *(undefined4 *)(__a + 3) = uVar11;
      *(undefined4 *)((long)__a + 0x1c) = uVar12;
      return;
    }
  }
  else {
    if (uVar6 < uVar8) {
      uVar1 = *__result;
      uVar2 = __result[1];
      uVar3 = __result[2];
      uVar4 = __result[3];
      uVar5 = __a[1];
      *__result = *__a;
      __result[1] = uVar5;
      uVar5 = __a[3];
      __result[2] = __a[2];
      __result[3] = uVar5;
      *__a = uVar1;
      __a[1] = uVar2;
      __a[2] = uVar3;
      __a[3] = uVar4;
      return;
    }
    uVar13 = *(undefined4 *)__result;
    uVar14 = *(undefined4 *)((long)__result + 4);
    uVar15 = *(undefined4 *)(__result + 1);
    uVar16 = *(undefined4 *)((long)__result + 0xc);
    uVar9 = *(undefined4 *)(__result + 2);
    uVar10 = *(undefined4 *)((long)__result + 0x14);
    uVar11 = *(undefined4 *)(__result + 3);
    uVar12 = *(undefined4 *)((long)__result + 0x1c);
    if (uVar8 <= uVar7) {
      uVar1 = __b[1];
      *__result = *__b;
      __result[1] = uVar1;
      uVar1 = __b[3];
      __result[2] = __b[2];
      __result[3] = uVar1;
      *(undefined4 *)__b = uVar13;
      *(undefined4 *)((long)__b + 4) = uVar14;
      *(undefined4 *)(__b + 1) = uVar15;
      *(undefined4 *)((long)__b + 0xc) = uVar16;
      *(undefined4 *)(__b + 2) = uVar9;
      *(undefined4 *)((long)__b + 0x14) = uVar10;
      *(undefined4 *)(__b + 3) = uVar11;
      *(undefined4 *)((long)__b + 0x1c) = uVar12;
      return;
    }
  }
  uVar1 = __c[1];
  *__result = *__c;
  __result[1] = uVar1;
  uVar1 = __c[3];
  __result[2] = __c[2];
  __result[3] = uVar1;
  *(undefined4 *)__c = uVar13;
  *(undefined4 *)((long)__c + 4) = uVar14;
  *(undefined4 *)(__c + 1) = uVar15;
  *(undefined4 *)((long)__c + 0xc) = uVar16;
  *(undefined4 *)(__c + 2) = uVar9;
  *(undefined4 *)((long)__c + 0x14) = uVar10;
  *(undefined4 *)(__c + 3) = uVar11;
  *(undefined4 *)((long)__c + 0x1c) = uVar12;
  return;
}

Assistant:

__forceinline unsigned geomID() const { 
      return lower.a;
    }